

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::Member::Member(Member *this,string *n,VarType *t)

{
  VarType *t_local;
  string *n_local;
  Member *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)n);
  glu::VarType::VarType(&this->type,t);
  return;
}

Assistant:

Member (const std::string& n, const glu::VarType& t) : name(n), type(t) {}